

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConditionalStatements.cpp
# Opt level: O3

ER __thiscall
slang::ast::ConditionalStatement::evalImpl(ConditionalStatement *this,EvalContext *context)

{
  char *pcVar1;
  ER EVar2;
  Diagnostic *pDVar3;
  char *pcVar4;
  bool bVar5;
  string_view arg;
  EvalConditionalVisitor visitor;
  EvalConditionalVisitor local_70;
  
  pcVar1 = local_70.items.super_SmallVectorBase<const_slang::ast::Statement_*>.firstElement;
  local_70.items.super_SmallVectorBase<const_slang::ast::Statement_*>.len = 0;
  local_70.items.super_SmallVectorBase<const_slang::ast::Statement_*>.cap = 5;
  local_70.bad = false;
  local_70.context = context;
  local_70.items.super_SmallVectorBase<const_slang::ast::Statement_*>.data_ = (pointer)pcVar1;
  Statement::visit<slang::ast::EvalConditionalVisitor&>(&this->super_Statement,&local_70);
  EVar2 = Fail;
  if (local_70.bad == false) {
    if (local_70.items.super_SmallVectorBase<const_slang::ast::Statement_*>.len == 0) {
      EVar2 = Success;
      if ((this->check | Unique0) == Priority) {
        pDVar3 = EvalContext::addDiag
                           (context,(DiagCode)0x14000c,
                            ((this->conditions)._M_ptr
                             [(this->conditions)._M_extent._M_extent_value - 1].expr.ptr)->
                            sourceRange);
        bVar5 = this->check == Priority;
        pcVar4 = "unique";
        if (bVar5) {
          pcVar4 = "priority";
        }
        arg._M_str = pcVar4;
        arg._M_len = (ulong)bVar5 * 2 + 6;
        Diagnostic::operator<<(pDVar3,arg);
      }
    }
    else {
      if (local_70.items.super_SmallVectorBase<const_slang::ast::Statement_*>.len != 1 &&
          this->check - Unique < 2) {
        pDVar3 = EvalContext::addDiag
                           (context,(DiagCode)0x11000c,
                            *(SourceRange *)
                             (*(long *)((long)local_70.items.
                                              super_SmallVectorBase<const_slang::ast::Statement_*>.
                                              data_ + 8) + 0x10));
        Diagnostic::addNote(pDVar3,(DiagCode)0xb0001,
                            *(SourceRange *)
                             ((long)*local_70.items.
                                     super_SmallVectorBase<const_slang::ast::Statement_*>.data_ +
                             0x10));
      }
      EVar2 = Statement::eval(*local_70.items.super_SmallVectorBase<const_slang::ast::Statement_*>.
                               data_,context);
    }
  }
  if (local_70.items.super_SmallVectorBase<const_slang::ast::Statement_*>.data_ != (pointer)pcVar1)
  {
    operator_delete(local_70.items.super_SmallVectorBase<const_slang::ast::Statement_*>.data_);
  }
  return EVar2;
}

Assistant:

ER ConditionalStatement::evalImpl(EvalContext& context) const {
    EvalConditionalVisitor visitor(context);
    this->visit(visitor);
    if (visitor.bad)
        return ER::Fail;

    if (visitor.items.empty()) {
        if (check == UniquePriorityCheck::Priority || check == UniquePriorityCheck::Unique) {
            auto& diag = context.addDiag(diag::ConstEvalNoIfItemsMatched,
                                         conditions.back().expr->sourceRange);
            diag << (check == UniquePriorityCheck::Priority ? "priority"sv : "unique"sv);
        }
        return ER::Success;
    }

    bool unique = check == UniquePriorityCheck::Unique || check == UniquePriorityCheck::Unique0;
    if (unique && visitor.items.size() > 1) {
        auto& diag = context.addDiag(diag::ConstEvalIfItemsNotUnique,
                                     visitor.items[1]->sourceRange);
        diag.addNote(diag::NotePreviousMatch, visitor.items[0]->sourceRange);
    }

    return visitor.items[0]->eval(context);
}